

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall amrex::MLEBABecLap::setEBHomogDirichlet(MLEBABecLap *this,int amrlev,MultiFab *beta)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  DistributionMapping *__args_2;
  FabArrayBase *fabarray_;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::EBCellFlagFab> *period;
  MFItInfo *this_01;
  FabArrayBase *in_RDX;
  long *in_RDI;
  int i_3;
  int j_3;
  int k_3;
  int n_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Array4<const_amrex::EBCellFlag> *flag;
  Array4<const_double> *betain;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType t;
  Array4<double> *betaout;
  Array4<double> *phifab;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int mglev_1;
  int ngrow;
  int mglev;
  bool phi_on_centroid;
  int beta_ncomp;
  int ncomp;
  MFIter *in_stack_fffffffffffff7b8;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff7c0;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  FabType in_stack_fffffffffffff7d4;
  undefined1 cross;
  MFInfo *in_stack_fffffffffffff7e8;
  Geometry *in_stack_fffffffffffff7f0;
  int *in_stack_fffffffffffff7f8;
  DistributionMapping *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  MFIter *in_stack_fffffffffffff820;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  int local_79c;
  int local_758;
  int local_754;
  int local_750;
  int local_74c;
  int in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  EBCellFlagFab *in_stack_fffffffffffff8e8;
  long local_708;
  long local_700;
  long local_6f8;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  long *local_6c8;
  long local_6c0 [8];
  long *local_680;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  undefined8 local_668;
  int local_660;
  undefined8 local_654;
  int local_64c;
  undefined8 local_648;
  int local_640;
  undefined8 local_638;
  int local_630;
  undefined4 in_stack_fffffffffffff9d8;
  int iVar4;
  undefined4 in_stack_fffffffffffff9dc;
  int iVar5;
  int local_620;
  int in_stack_fffffffffffff9e4;
  int iVar6;
  char *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  long local_5d8 [8];
  long *local_598;
  long local_590 [8];
  long *local_550;
  int local_544 [7];
  int *local_528;
  MFIter local_520;
  MFItInfo local_4bc;
  FabArray<amrex::EBCellFlagFab> *local_4a8;
  FabArray<amrex::FArrayBox> *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined4 local_464;
  int local_458;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  uint local_40c;
  undefined4 local_408;
  byte local_401;
  int local_400;
  int local_3fc;
  FabArrayBase *local_3f8;
  undefined8 local_3e0;
  undefined4 local_3d4;
  char *local_3d0;
  char *local_3c8;
  undefined8 local_3c0;
  int local_3b8;
  int *local_3b0;
  int local_3a4;
  int iStack_3a0;
  int local_39c;
  EBCellFlagFab *local_398;
  int local_390;
  int *local_388;
  int local_37c;
  int iStack_378;
  int local_374;
  undefined8 local_370;
  int local_368;
  int *local_360;
  int local_354;
  int iStack_350;
  int local_34c;
  undefined8 local_348;
  int local_340;
  int *local_338;
  int local_32c;
  int iStack_328;
  int local_324;
  undefined8 local_320;
  int local_318;
  int *local_310;
  int local_304;
  int iStack_300;
  int local_2fc;
  undefined8 local_2f8;
  int local_2f0;
  int *local_2e8;
  int local_2dc;
  int iStack_2d8;
  int local_2d4;
  undefined8 local_2d0;
  int local_2c8;
  int *local_2c0;
  int local_2b4;
  int iStack_2b0;
  int local_2ac;
  undefined8 local_2a8;
  int local_2a0;
  int *local_298;
  int local_28c;
  int iStack_288;
  int local_284;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  long *local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  long *local_258;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  long *local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  long *local_228;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  long *local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  long *local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  long *local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long *local_1c8;
  uint *local_1c0;
  uint *local_1b8;
  undefined4 local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  long *local_188;
  undefined4 local_17c;
  int *local_178;
  undefined4 local_16c;
  int *local_168;
  undefined4 local_15c;
  int *local_158;
  undefined4 local_14c;
  int *local_148;
  undefined4 local_13c;
  int *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  int *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_3f8 = in_RDX;
  local_3fc = (**(code **)(*in_RDI + 0x28))();
  local_400 = FabArrayBase::nComp(local_3f8);
  local_401 = *(int *)((long)in_RDI + 0x32c) == 3;
  if ((local_400 != 1) && (local_400 != local_3fc)) {
    local_3c8 = "beta_ncomp == 1 || beta_ncomp == ncomp";
    local_3d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
    ;
    local_3d4 = 399;
    local_3e0 = 0;
    Assert_host((char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e4,
                (char *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
  }
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
  bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  if (bVar2) {
    local_408 = 0;
    local_40c = local_401 & 1;
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    in_stack_fffffffffffff820 = (MFIter *)0x0;
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    local_438 = 0;
    uStack_430 = 0;
    local_448 = 0;
    uStack_440 = 0;
    local_428 = 0;
    MFInfo::MFInfo((MFInfo *)0x14df50c);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    in_stack_fffffffffffff7b8 =
         (MFIter *)
         std::
         unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)in_stack_fffffffffffff7c0);
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              ((BoxArray *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0,
               in_stack_fffffffffffff7e8,(FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff820);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff7c0,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff7b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff7c0);
    MFInfo::~MFInfo((MFInfo *)0x14df5c0);
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
  bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  if (bVar2) {
    local_458 = 0;
    while (iVar6 = local_458,
          piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c0,
                              (size_type)in_stack_fffffffffffff7b8), iVar6 < *piVar3) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      in_stack_fffffffffffff7f0 =
           (Geometry *)
           Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                     ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                      in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      __args_2 = Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
                 operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      local_464 = 0;
      local_488 = 0;
      uStack_480 = 0;
      local_498 = 0;
      uStack_490 = 0;
      local_478 = 0;
      MFInfo::MFInfo((MFInfo *)0x14df6f0);
      Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      in_stack_fffffffffffff7b8 =
           (MFIter *)
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffff7c0);
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                ((BoxArray *)CONCAT44(iVar6,in_stack_fffffffffffff808),
                 (DistributionMapping *)in_stack_fffffffffffff7b8,(int *)__args_2,
                 (int *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                 (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff820);
      Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff7c0,
                 (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff7b8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff7c0);
      MFInfo::~MFInfo((MFInfo *)0x14df7b7);
      local_458 = local_458 + 1;
    }
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
  fabarray_ = (FabArrayBase *)
              std::
              unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     *)in_stack_fffffffffffff7c0);
  if (fabarray_ == (FabArrayBase *)0x0) {
    this_00 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    this_00 = (FabArray<amrex::FArrayBox> *)
              __dynamic_cast(fabarray_,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
  }
  local_4a0 = this_00;
  if (this_00 == (FabArray<amrex::FArrayBox> *)0x0) {
    period = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    period = EBFArrayBoxFactory::getMultiEBCellFlagFab
                       ((EBFArrayBoxFactory *)in_stack_fffffffffffff7c0);
  }
  local_4a8 = period;
  MFItInfo::MFItInfo((MFItInfo *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  this_01 = MFItInfo::EnableTiling(&local_4bc,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_01,true);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffff7c0);
  MFIter::MFIter((MFIter *)in_stack_fffffffffffff7f0,fabarray_,(MFItInfo *)this_00);
  while( true ) {
    cross = (undefined1)((uint)in_stack_fffffffffffff7d4 >> 0x18);
    bVar2 = MFIter::isValid(&local_520);
    if (!bVar2) break;
    MFIter::tilebox(in_stack_fffffffffffff820);
    local_528 = local_544;
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14df96b);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff7c8,
               (MFIter *)in_stack_fffffffffffff7c0);
    local_550 = local_590;
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14df9c0);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff7c8,
               (MFIter *)in_stack_fffffffffffff7c0);
    local_598 = local_5d8;
    if (local_4a8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      in_stack_fffffffffffff7d4 = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
      in_stack_fffffffffffff7d4 =
           EBCellFlagFab::getType
                     (in_stack_fffffffffffff8e8,
                      (Box *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    }
    local_338 = local_528;
    local_98 = local_528;
    local_9c = 0;
    local_32c = *local_528;
    local_a8 = local_528;
    local_ac = 1;
    iStack_328 = local_528[1];
    local_348 = *(undefined8 *)local_528;
    local_b8 = local_528;
    local_bc = 2;
    local_340 = local_528[2];
    local_298 = local_528;
    local_158 = local_528 + 3;
    local_15c = 0;
    local_28c = *local_158;
    local_168 = local_528 + 3;
    local_16c = 1;
    iStack_288 = local_528[4];
    local_2a8 = *(undefined8 *)local_158;
    local_178 = local_528 + 3;
    local_17c = 2;
    local_2a0 = local_528[5];
    for (iVar6 = 0; local_620 = local_340, iVar6 < local_3fc; iVar6 = iVar6 + 1) {
      for (; iVar5 = iStack_328, local_620 <= local_2a0; local_620 = local_620 + 1) {
        for (; iVar1 = local_32c, iVar5 <= iStack_288; iVar5 = iVar5 + 1) {
          while (iVar4 = iVar1, iVar4 <= local_28c) {
            local_1f8 = local_550;
            local_204 = local_620;
            *(undefined8 *)
             (*local_550 +
             ((long)(iVar4 - (int)local_550[4]) +
              (long)(iVar5 - *(int *)((long)local_550 + 0x24)) * local_550[1] +
              (long)(local_620 - (int)local_550[5]) * local_550[2] + (long)iVar6 * local_550[3]) * 8
             ) = 0;
            local_208 = iVar6;
            local_200 = iVar5;
            local_1fc = iVar4;
            iVar1 = iVar4 + 1;
          }
        }
      }
    }
    local_324 = local_340;
    local_284 = local_2a0;
    if ((in_stack_fffffffffffff7d4 == regular) || (in_stack_fffffffffffff7d4 == covered)) {
      local_360 = local_528;
      local_68 = local_528;
      local_6c = 0;
      local_354 = *local_528;
      local_78 = local_528;
      local_7c = 1;
      iStack_350 = local_528[1];
      local_648 = *(undefined8 *)local_528;
      local_88 = local_528;
      local_8c = 2;
      local_640 = local_528[2];
      local_2c0 = local_528;
      local_128 = local_528 + 3;
      local_12c = 0;
      local_2b4 = *local_128;
      local_138 = local_528 + 3;
      local_13c = 1;
      iStack_2b0 = local_528[4];
      local_668 = *(undefined8 *)local_128;
      local_148 = local_528 + 3;
      local_14c = 2;
      local_660 = local_528[5];
      for (local_66c = 0; iVar6 = local_640, local_654 = local_668, local_64c = local_660,
          local_638 = local_648, local_630 = local_640, local_370 = local_648, local_368 = local_640
          , local_34c = local_640, local_2d0 = local_668, local_2c8 = local_660,
          local_2ac = local_660, local_66c < local_3fc; local_66c = local_66c + 1) {
        while (local_670 = iVar6, iVar6 = iStack_350, local_670 <= local_660) {
          while (local_674 = iVar6, iVar6 = local_354, local_674 <= iStack_2b0) {
            while (local_678 = iVar6, local_678 <= local_2b4) {
              local_210 = local_598;
              local_214 = local_678;
              local_218 = local_674;
              local_21c = local_670;
              local_220 = local_66c;
              *(undefined8 *)
               (*local_598 +
               ((long)(local_678 - (int)local_598[4]) +
                (long)(local_674 - *(int *)((long)local_598 + 0x24)) * local_598[1] +
                (long)(local_670 - (int)local_598[5]) * local_598[2] +
               (long)local_66c * local_598[3]) * 8) = 0;
              iVar6 = local_678 + 1;
            }
            iVar6 = local_674 + 1;
          }
          iVar6 = local_670 + 1;
        }
      }
    }
    else {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff7c8,
                 (MFIter *)in_stack_fffffffffffff7c0);
      local_680 = local_6c0;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (in_stack_fffffffffffff7c8,(MFIter *)in_stack_fffffffffffff7c0);
      local_6c8 = &local_708;
      if (local_400 == local_3fc) {
        local_388 = local_528;
        local_38 = local_528;
        local_3c = 0;
        local_37c = *local_528;
        local_48 = local_528;
        local_4c = 1;
        iStack_378 = local_528[1];
        in_stack_fffffffffffff8e8 = *(EBCellFlagFab **)local_528;
        local_58 = local_528;
        local_5c = 2;
        in_stack_fffffffffffff8e0 = local_528[2];
        local_2e8 = local_528;
        local_f8 = local_528 + 3;
        local_fc = 0;
        local_2dc = *local_f8;
        local_108 = local_528 + 3;
        local_10c = 1;
        iStack_2d8 = local_528[4];
        local_2f8 = *(undefined8 *)local_f8;
        local_118 = local_528 + 3;
        local_11c = 2;
        local_2f0 = local_528[5];
        for (local_74c = 0; local_750 = in_stack_fffffffffffff8e0,
            local_398 = in_stack_fffffffffffff8e8, local_390 = in_stack_fffffffffffff8e0,
            local_374 = in_stack_fffffffffffff8e0, local_2d4 = local_2f0, local_74c < local_3fc;
            local_74c = local_74c + 1) {
          for (; local_754 = iStack_378, local_750 <= local_2f0; local_750 = local_750 + 1) {
            for (; local_758 = local_37c, local_754 <= iStack_2d8; local_754 = local_754 + 1) {
              for (; local_758 <= local_2dc; local_758 = local_758 + 1) {
                local_1cc = local_758;
                local_1d0 = local_754;
                local_1d4 = local_750;
                local_1b8 = (uint *)(local_708 +
                                    ((long)(local_758 - local_6e8) +
                                     (local_754 - local_6e4) * local_700 +
                                    (local_750 - local_6e0) * local_6f8) * 4);
                if ((*local_1b8 & 3) == 1) {
                  local_188 = local_680;
                  local_18c = local_758;
                  local_190 = local_754;
                  local_194 = local_750;
                  local_198 = local_74c;
                  local_228 = local_598;
                  local_22c = local_758;
                  local_230 = local_754;
                  local_234 = local_750;
                  local_238 = local_74c;
                  *(undefined8 *)
                   (*local_598 +
                   ((long)(local_758 - (int)local_598[4]) +
                    (long)(local_754 - *(int *)((long)local_598 + 0x24)) * local_598[1] +
                    (long)(local_750 - (int)local_598[5]) * local_598[2] +
                   (long)local_74c * local_598[3]) * 8) =
                       *(undefined8 *)
                        (*local_680 +
                        ((long)(local_758 - (int)local_680[4]) +
                         (long)(local_754 - *(int *)((long)local_680 + 0x24)) * local_680[1] +
                         (long)(local_750 - (int)local_680[5]) * local_680[2] +
                        (long)local_74c * local_680[3]) * 8);
                }
                else {
                  local_240 = local_598;
                  local_244 = local_758;
                  local_248 = local_754;
                  local_24c = local_750;
                  local_250 = local_74c;
                  *(undefined8 *)
                   (*local_598 +
                   ((long)(local_758 - (int)local_598[4]) +
                    (long)(local_754 - *(int *)((long)local_598 + 0x24)) * local_598[1] +
                    (long)(local_750 - (int)local_598[5]) * local_598[2] +
                   (long)local_74c * local_598[3]) * 8) = 0;
                }
                local_1c8 = local_6c8;
              }
            }
          }
        }
      }
      else {
        local_3b0 = local_528;
        local_8 = local_528;
        local_c = 0;
        local_3a4 = *local_528;
        local_18 = local_528;
        local_1c = 1;
        iStack_3a0 = local_528[1];
        local_3c0 = *(undefined8 *)local_528;
        local_28 = local_528;
        local_2c = 2;
        local_3b8 = local_528[2];
        local_310 = local_528;
        local_c8 = local_528 + 3;
        local_cc = 0;
        local_304 = *local_c8;
        local_d8 = local_528 + 3;
        local_dc = 1;
        iStack_300 = local_528[4];
        local_320 = *(undefined8 *)local_c8;
        local_e8 = local_528 + 3;
        local_ec = 2;
        local_318 = local_528[5];
        for (local_79c = 0; local_7a0 = local_3b8, local_39c = local_3b8, local_2fc = local_318,
            local_79c < local_3fc; local_79c = local_79c + 1) {
          for (; local_7a4 = iStack_3a0, local_7a0 <= local_318; local_7a0 = local_7a0 + 1) {
            for (; local_7a8 = local_3a4, local_7a4 <= iStack_300; local_7a4 = local_7a4 + 1) {
              for (; local_7a8 <= local_304; local_7a8 = local_7a8 + 1) {
                local_1e4 = local_7a8;
                local_1e8 = local_7a4;
                local_1ec = local_7a0;
                local_1c0 = (uint *)(local_708 +
                                    ((long)(local_7a8 - local_6e8) +
                                     (local_7a4 - local_6e4) * local_700 +
                                    (local_7a0 - local_6e0) * local_6f8) * 4);
                if ((*local_1c0 & 3) == 1) {
                  local_1a0 = local_680;
                  local_1a4 = local_7a8;
                  local_1a8 = local_7a4;
                  local_1ac = local_7a0;
                  local_1b0 = 0;
                  local_258 = local_598;
                  local_25c = local_7a8;
                  local_260 = local_7a4;
                  local_264 = local_7a0;
                  local_268 = local_79c;
                  *(undefined8 *)
                   (*local_598 +
                   ((long)(local_7a8 - (int)local_598[4]) +
                    (long)(local_7a4 - *(int *)((long)local_598 + 0x24)) * local_598[1] +
                    (long)(local_7a0 - (int)local_598[5]) * local_598[2] +
                   (long)local_79c * local_598[3]) * 8) =
                       *(undefined8 *)
                        (*local_680 +
                        ((long)(local_7a8 - (int)local_680[4]) +
                         (long)(local_7a4 - *(int *)((long)local_680 + 0x24)) * local_680[1] +
                        (long)(local_7a0 - (int)local_680[5]) * local_680[2]) * 8);
                }
                else {
                  local_270 = local_598;
                  local_274 = local_7a8;
                  local_278 = local_7a4;
                  local_27c = local_7a0;
                  local_280 = local_79c;
                  *(undefined8 *)
                   (*local_598 +
                   ((long)(local_7a8 - (int)local_598[4]) +
                    (long)(local_7a4 - *(int *)((long)local_598 + 0x24)) * local_598[1] +
                    (long)(local_7a0 - (int)local_598[5]) * local_598[2] +
                   (long)local_79c * local_598[3]) * 8) = 0;
                }
                local_1e0 = local_6c8;
              }
            }
          }
        }
      }
    }
    MFIter::operator++(&local_520);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff7c0);
  if ((local_401 & 1) != 0) {
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14e0d62);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
    Geometry::periodicity(in_stack_fffffffffffff7f0);
    FabArray<amrex::FArrayBox>::FillBoundary<double>(this_00,(Periodicity *)period,(bool)cross);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBHomogDirichlet (int amrlev, const MultiFab& beta)
{
    const int ncomp = getNComp();
    const int beta_ncomp = beta.nComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    AMREX_ALWAYS_ASSERT(beta_ncomp == 1 || beta_ncomp == ncomp);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*m_eb_phi[amrlev], mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phifab = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            phifab(i,j,k,n) = 0.0;
        });
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& betain = beta.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            if (beta_ncomp == ncomp) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        betaout(i,j,k,n) = betain(i,j,k,n);
                    } else {
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        betaout(i,j,k,n) = betain(i,j,k,0);
                    } else {
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            }
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}